

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetYProbabilitiesExactScopes
          (TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Aii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Yii,Index *yIndex)

{
  Index IVar1;
  ulong uVar2;
  const_reference ppCVar3;
  reference pvVar4;
  undefined8 *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  uint *in_R9;
  value_type extraout_XMM0_Qa;
  value_type vVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  Index in_stack_0000001c;
  TwoStageDynamicBayesianNetwork *in_stack_00000020;
  Index valI;
  Index iiI;
  size_t nrVals;
  vector<double,_std::allocator<double>_> *probs;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<double,_std::allocator<double>_> *this_00;
  uint local_64;
  
  this_00 = in_RDI;
  uVar2 = (**(code **)(*(long *)*in_RSI + 0x1a8))((long *)*in_RSI,*in_R9);
  vVar5 = extraout_XMM0_Qa;
  std::allocator<double>::allocator((allocator<double> *)0xaf36d0);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(size_type)in_RSI,(value_type_conflict3 *)in_RDI,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::allocator<double>::~allocator((allocator<double> *)0xaf36f5);
  IVar1 = IndividualToJointYiiIndices
                    (in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                     unaff_retaddr);
  for (local_64 = 0; local_64 < uVar2; local_64 = local_64 + 1) {
    ppCVar3 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::
              operator[]((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                         (in_RSI + 0x50),(ulong)*in_R9);
    (*(*ppCVar3)->_vptr_CPDDiscreteInterface[2])(*ppCVar3,(ulong)local_64,(ulong)IVar1);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_64);
    *pvVar4 = vVar5;
  }
  return in_RDI;
}

Assistant:

vector<double> TwoStageDynamicBayesianNetwork::
GetYProbabilitiesExactScopes( 
                    const vector<Index>& Xii,
                    const vector<Index>& Aii,
                    const vector<Index>& Yii,
                    const Index& yIndex
                ) const
{
    size_t nrVals = _m_madp->GetNrValuesForFactor(yIndex);
    vector<double> probs(nrVals, 0.0);
    Index iiI = IndividualToJointYiiIndices(yIndex, Xii, Aii, Yii);
    for(Index valI=0; valI < nrVals; valI++)
    {
        probs[valI] = _m_Y_CPDs[yIndex]->Get(valI, iiI);
    }
    return(probs);
}